

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

CoverCrossSyntax * __thiscall
slang::parsing::Parser::parseCoverCross(Parser *this,AttrList attributes,NamedLabelSyntax *label)

{
  Token identifier;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_00;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> elements_01;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_02;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_03;
  Token cross;
  Token cross_00;
  Token openBrace_00;
  Token openBrace_01;
  Token closeBrace_00;
  Token closeBrace_01;
  Token emptySemi;
  Token emptySemi_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  Info *extraout_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Token TVar4;
  Token TVar5;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token closeBrace;
  Token openBrace;
  CoverageIffClauseSyntax *iff;
  Token name;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token keyword;
  ParserBase *in_stack_fffffffffffffab8;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *in_stack_fffffffffffffac0;
  undefined6 in_stack_fffffffffffffac8;
  TokenKind in_stack_ffffffffffffface;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffad0;
  ParserBase *in_stack_fffffffffffffae0;
  Info *in_stack_fffffffffffffaf8;
  CoverageIffClauseSyntax *in_stack_fffffffffffffb10;
  CoverageIffClauseSyntax *pCVar6;
  undefined8 in_stack_fffffffffffffb18;
  ParserBase *in_stack_fffffffffffffb20;
  Info *pIVar7;
  SourceLocation in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  DiagCode in_stack_fffffffffffffb34;
  undefined8 *puVar8;
  Parser *in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  undefined6 in_stack_fffffffffffffb48;
  undefined6 uVar9;
  TokenKind in_stack_fffffffffffffb4e;
  undefined2 uVar10;
  ParserBase *in_stack_fffffffffffffb50;
  NamedLabelSyntax *local_408;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSStack_400;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> local_3f8;
  SyntaxList<slang::syntax::MemberSyntax> *local_3b0;
  undefined8 local_368;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  SyntaxKind parentKind;
  Token *in_stack_fffffffffffffcb0;
  TokenKind in_stack_fffffffffffffcbe;
  Parser *in_stack_fffffffffffffcc0;
  SyntaxFactory *local_308;
  undefined8 uStack_300;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> local_2d0;
  Token local_298;
  undefined8 local_280;
  undefined8 local_238;
  Info *pIStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> local_1d8;
  NamedLabelSyntax *local_1c8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSStack_1c0;
  Token local_1b8;
  CoverageIffClauseSyntax *local_1a8;
  Token local_1a0;
  SourceLocation local_190;
  undefined4 local_184;
  Token local_180;
  Token local_158;
  Token local_120;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_110 [4];
  Token local_38;
  undefined8 local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  CoverCrossSyntax *local_8;
  SyntaxList<slang::syntax::MemberSyntax> *members_00;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  uStack_10 = in_RDX;
  local_38 = ParserBase::expect(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4e);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x8d530e);
  while( true ) {
    TVar4 = ParserBase::expect(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4e);
    identifier.info = (Info *)in_stack_fffffffffffffac0;
    identifier._0_8_ = in_stack_fffffffffffffab8;
    local_158 = TVar4;
    local_120 = TVar4;
    slang::syntax::SyntaxFactory::identifierName((SyntaxFactory *)0x8d5388,identifier);
    slang::syntax::TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_fffffffffffffac0,(SyntaxNode *)in_stack_fffffffffffffab8);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffac0,
               (TokenOrSyntax *)in_stack_fffffffffffffab8);
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffad0._M_extent_value,
                             in_stack_ffffffffffffface);
    parentKind = (SyntaxKind)((ulong)in_stack_fffffffffffffca8 >> 0x20);
    if (!bVar1) break;
    TVar5 = ParserBase::consume(in_stack_fffffffffffffae0);
    TVar4.rawLen._2_2_ = in_stack_ffffffffffffface;
    TVar4._0_6_ = in_stack_fffffffffffffac8;
    TVar4.info = (Info *)in_stack_fffffffffffffad0._M_extent_value;
    local_180 = TVar5;
    slang::syntax::TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_stack_fffffffffffffac0,TVar4);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffac0,
               (TokenOrSyntax *)in_stack_fffffffffffffab8);
  }
  sVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::size(local_110);
  if (sVar3 < 2) {
    local_184 = 0x120005;
    local_1a0 = ParserBase::peek(in_stack_fffffffffffffab8);
    local_190 = Token::location(&local_1a0);
    ParserBase::addDiag(in_stack_fffffffffffffb20,in_stack_fffffffffffffb34,
                        in_stack_fffffffffffffb28);
  }
  local_1a8 = parseCoverageIffClause(in_stack_fffffffffffffb38);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffad0._M_extent_value,
                           in_stack_ffffffffffffface);
  if (bVar1) {
    local_1b8 = ParserBase::consume(in_stack_fffffffffffffae0);
    Token::Token((Token *)in_stack_fffffffffffffac0);
    local_1d8 = parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseCoverCross(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::syntax::NamedLabelSyntax*)::__0>
                          (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbe,
                           in_stack_fffffffffffffcb0,parentKind,in_stack_fffffffffffffca0);
    local_228 = local_18;
    uStack_220 = uStack_10;
    elements._M_ptr._6_2_ = in_stack_ffffffffffffface;
    elements._M_ptr._0_6_ = in_stack_fffffffffffffac8;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffad0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffac0,
               elements);
    TVar4 = local_38;
    uVar9 = (undefined6)local_28;
    uVar10 = (undefined2)((ulong)local_28 >> 0x30);
    local_238._0_2_ = local_38.kind;
    local_238._2_1_ = local_38._2_1_;
    local_238._3_1_ = local_38.numFlags.raw;
    local_238._4_4_ = local_38.rawLen;
    pIStack_230 = local_38.info;
    local_38 = TVar4;
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (local_110,(EVP_PKEY_CTX *)*in_RDI,src);
    local_280 = CONCAT44(extraout_var,iVar2);
    elements_00._M_ptr._6_2_ = in_stack_ffffffffffffface;
    elements_00._M_ptr._0_6_ = in_stack_fffffffffffffac8;
    elements_00._M_extent._M_extent_value = in_stack_fffffffffffffad0._M_extent_value;
    slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::SeparatedSyntaxList
              (in_stack_fffffffffffffac0,elements_00);
    elements_01._M_ptr._6_2_ = in_stack_ffffffffffffface;
    elements_01._M_ptr._0_6_ = in_stack_fffffffffffffac8;
    elements_01._M_extent._M_extent_value = in_stack_fffffffffffffad0._M_extent_value;
    pCVar6 = local_1a8;
    local_298 = local_1b8;
    slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_fffffffffffffac0,elements_01);
    Token::Token((Token *)in_stack_fffffffffffffac0);
    cross.info = in_stack_fffffffffffffaf8;
    cross._0_8_ = uStack_300;
    openBrace_00.info = (Info *)in_stack_fffffffffffffb20;
    openBrace_00.kind = (short)in_stack_fffffffffffffb18;
    openBrace_00._2_1_ = (char)((ulong)in_stack_fffffffffffffb18 >> 0x10);
    openBrace_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb18 >> 0x18);
    openBrace_00.rawLen = (int)((ulong)in_stack_fffffffffffffb18 >> 0x20);
    closeBrace_00.rawLen._0_2_ = in_stack_fffffffffffffb34.subsystem;
    closeBrace_00.rawLen._2_2_ = in_stack_fffffffffffffb34.code;
    closeBrace_00.kind = (short)in_stack_fffffffffffffb30;
    closeBrace_00._2_1_ = (char)((uint)in_stack_fffffffffffffb30 >> 0x10);
    closeBrace_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffb30 >> 0x18);
    closeBrace_00.info = (Info *)in_stack_fffffffffffffb38;
    emptySemi.info._0_6_ = uVar9;
    emptySemi._0_8_ = pCVar6;
    emptySemi.info._6_2_ = uVar10;
    local_8 = slang::syntax::SyntaxFactory::coverCross
                        (local_308,pSStack_1c0,local_1c8,cross,&local_2d0,in_stack_fffffffffffffb10,
                         openBrace_00,
                         (SyntaxList<slang::syntax::MemberSyntax> *)in_stack_fffffffffffffb28,
                         closeBrace_00,emptySemi);
  }
  else {
    puVar8 = in_RDI + 0x1c;
    elements_02._M_ptr._6_2_ = in_stack_ffffffffffffface;
    elements_02._M_ptr._0_6_ = in_stack_fffffffffffffac8;
    elements_02._M_extent._M_extent_value = in_stack_fffffffffffffad0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffac0,
               elements_02);
    TVar4 = local_38;
    local_368._0_2_ = local_38.kind;
    local_368._2_1_ = local_38._2_1_;
    local_368._3_1_ = local_38.numFlags.raw;
    local_368._4_4_ = local_38.rawLen;
    local_38 = TVar4;
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (local_110,(EVP_PKEY_CTX *)*in_RDI,src_00);
    members_00 = (SyntaxList<slang::syntax::MemberSyntax> *)CONCAT44(extraout_var_00,iVar2);
    elements_03._M_ptr._6_2_ = in_stack_ffffffffffffface;
    elements_03._M_ptr._0_6_ = in_stack_fffffffffffffac8;
    elements_03._M_extent._M_extent_value = in_stack_fffffffffffffad0._M_extent_value;
    pIVar7 = extraout_RDX;
    local_3b0 = members_00;
    slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::SeparatedSyntaxList
              (in_stack_fffffffffffffac0,elements_03);
    pCVar6 = local_1a8;
    Token::Token((Token *)in_stack_fffffffffffffac0);
    slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_fffffffffffffad0._M_extent_value,
               (nullptr_t)CONCAT26(in_stack_ffffffffffffface,in_stack_fffffffffffffac8));
    Token::Token((Token *)in_stack_fffffffffffffac0);
    TVar4 = ParserBase::expect(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4e);
    cross_00.info = in_stack_fffffffffffffaf8;
    cross_00._0_8_ = TVar4.info;
    openBrace_01.info = pIVar7;
    openBrace_01.kind = (short)local_28;
    openBrace_01._2_1_ = (char)((ulong)local_28 >> 0x10);
    openBrace_01.numFlags.raw = (char)((ulong)local_28 >> 0x18);
    openBrace_01.rawLen = (int)((ulong)local_28 >> 0x20);
    closeBrace_01.info = (Info *)in_stack_fffffffffffffb38;
    closeBrace_01._0_8_ = puVar8;
    emptySemi_00.info._0_6_ = in_stack_fffffffffffffb48;
    emptySemi_00.kind = (short)in_stack_fffffffffffffb40;
    emptySemi_00._2_1_ = (char)((ulong)in_stack_fffffffffffffb40 >> 0x10);
    emptySemi_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb40 >> 0x18);
    emptySemi_00.rawLen = (int)((ulong)in_stack_fffffffffffffb40 >> 0x20);
    emptySemi_00.info._6_2_ = in_stack_fffffffffffffb4e;
    local_8 = slang::syntax::SyntaxFactory::coverCross
                        (TVar4._0_8_,pSStack_400,local_408,cross_00,&local_3f8,pCVar6,openBrace_01,
                         members_00,closeBrace_01,emptySemi_00);
  }
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x8d59d7);
  return local_8;
}

Assistant:

CoverCrossSyntax* Parser::parseCoverCross(AttrList attributes, NamedLabelSyntax* label) {
    auto keyword = expect(TokenKind::CrossKeyword);

    SmallVector<TokenOrSyntax, 8> buffer;
    while (true) {
        auto name = expect(TokenKind::Identifier);
        buffer.push_back(&factory.identifierName(name));
        if (!peek(TokenKind::Comma))
            break;

        buffer.push_back(consume());
    }

    if (buffer.size() < 2)
        addDiag(diag::CoverCrossItems, peek().location());

    auto iff = parseCoverageIffClause();

    if (peek(TokenKind::OpenBrace)) {
        auto openBrace = consume();

        Token closeBrace;
        auto members = parseMemberList<MemberSyntax>(
            TokenKind::CloseBrace, closeBrace, SyntaxKind::CoverCross,
            [this](SyntaxKind, bool&) { return parseCoverCrossMember(); });

        return &factory.coverCross(attributes, label, keyword, buffer.copy(alloc), iff, openBrace,
                                   members, closeBrace, Token());
    }

    // no brace, so this is an empty list, expect a semicolon
    return &factory.coverCross(attributes, label, keyword, buffer.copy(alloc), iff, Token(),
                               nullptr, Token(), expect(TokenKind::Semicolon));
}